

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

FaceData * __thiscall
Ptex::v2_2::PtexReader::getFace(PtexReader *this,int levelid,Level *level,int faceid,Res res)

{
  reference ppFVar1;
  int in_ECX;
  long in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  Res res_00;
  FaceData **face;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  res_00 = SUB82((ulong)in_RDI >> 0x30,0);
  ppFVar1 = std::
            vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
            ::operator[]((vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                          *)(in_RDX + 0x30),(long)in_ECX);
  if (*ppFVar1 == (value_type)0x0) {
    readFace((PtexReader *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(int)((ulong)in_RDX >> 0x20),
             (Level *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),(int)((ulong)ppFVar1 >> 0x20),
             res_00);
  }
  return *ppFVar1;
}

Assistant:

FaceData* getFace(int levelid, Level* level, int faceid, Res res)
    {
        FaceData*& face = level->faces[faceid];
        if (!face) readFace(levelid, level, faceid, res);
        return face;
    }